

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O2

void __thiscall backend::codegen::RegAllocator::perform_load_stores(RegAllocator *this)

{
  string *file;
  pointer puVar1;
  __uniq_ptr_data<arm::Inst,_std::default_delete<arm::Inst>,_true,_true> _Var2;
  _func_int **pp_Var3;
  Inst *pIVar4;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var5;
  _Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_> *p_Var6;
  bool bVar7;
  int iVar8;
  ostream *poVar9;
  pair<unsigned_int,_unsigned_int> *ppVar10;
  long lVar11;
  iterator iVar12;
  iterator __position;
  undefined8 *puVar13;
  Inst *__tmp;
  _Optional_payload_base<unsigned_int> pre_alloc_transient;
  Reg RVar14;
  _List_node_base *p_Var15;
  Tag *in_RSI;
  Function *function;
  Reg *__v;
  int i_00;
  ulong uVar16;
  int i;
  Reg RVar17;
  Reg RVar18;
  ReplaceWriteAction r_00;
  ReplaceWriteAction RVar19;
  ostream local_199;
  vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
  *local_198;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_190;
  allocator<char> local_182;
  allocator<char> local_181;
  _List_node_base *local_180;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_178;
  _func_int **local_170;
  _Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_> *local_168;
  _func_int **local_160;
  _func_int **local_158;
  _func_int **local_150;
  undefined1 *local_148;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_140;
  _func_int **local_138;
  _func_int **local_130;
  _func_int **local_128;
  _func_int **local_120;
  _func_int **local_118;
  Reg r;
  bool local_108;
  undefined **local_b8;
  undefined8 local_b0;
  undefined1 local_a8;
  undefined1 local_a0 [112];
  
  local_198 = (vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
               *)&this->inst_sink;
  local_168 = (_Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_> *)&this->delayed_store
  ;
  local_180 = (_List_node_base *)&this->active_reg_map;
  local_140 = &(this->spilled_cross_block_reg)._M_h;
  local_190 = &(this->wrote_to)._M_h;
  local_118 = (_func_int **)&PTR_display_001db900;
  local_120 = (_func_int **)&PTR_display_001db8c0;
  local_128 = (_func_int **)&PTR_display_001db940;
  local_170 = (_func_int **)&PTR_display_001db9c0;
  local_130 = (_func_int **)&PTR_display_001dba00;
  local_138 = (_func_int **)&PTR_display_001dba40;
  local_150 = (_func_int **)&PTR_display_001db748;
  local_158 = (_func_int **)&PTR_display_001db980;
  local_160 = (_func_int **)&PTR_display_001dba98;
  local_178 = &(this->active)._M_h;
  uVar16 = 0;
  file = (string *)(local_a0 + 0x20);
  do {
    puVar1 = (this->f->inst).
             super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->f->inst).
                      super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= uVar16) {
      return;
    }
    _Var2.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
    super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         puVar1[uVar16]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>;
    local_199 = (ostream)0x0;
    AixLog::operator<<(&local_199,(Severity *)in_RSI);
    AixLog::Tag::Tag((Tag *)(local_a0 + 0x40));
    AixLog::operator<<((ostream *)(local_a0 + 0x40),in_RSI);
    local_b0 = std::chrono::_V2::system_clock::now();
    local_b8 = &PTR__Timestamp_001d8f28;
    local_a8 = 0;
    AixLog::operator<<((ostream *)&local_b8,(Timestamp *)in_RSI);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a0,"perform_load_stores",&local_181);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)file,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
               ,&local_182);
    function = (Function *)local_a0;
    AixLog::Function::Function((Function *)&r,(string *)function,file,0x39a);
    AixLog::operator<<((ostream *)&r,function);
    poVar9 = std::operator<<((ostream *)&std::clog," ");
    poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
    (*(code *)**(undefined8 **)
                _Var2.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
                super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl)
              (_Var2.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
               super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl,poVar9);
    std::endl<char,std::char_traits<char>>(poVar9);
    AixLog::Function::~Function((Function *)&r);
    std::__cxx11::string::~string((string *)file);
    std::__cxx11::string::~string((string *)local_a0);
    AixLog::Tag::~Tag((Tag *)(local_a0 + 0x40));
    p_Var6 = local_168;
    this->cur_cond =
         *(ConditionCode *)
          ((long)_Var2.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
                 super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0xc);
    pp_Var3 = *(_func_int ***)
               _Var2.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
               super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    i_00 = (int)uVar16;
    if (pp_Var3 == local_118) {
      replace_read(this,(Reg *)((long)_Var2.
                                      super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                      .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x14
                               ),i_00,(optional<unsigned_int>)0x0);
      goto LAB_0015fc8c;
    }
    if (pp_Var3 == local_120) {
      replace_read(this,(Reg *)((long)_Var2.
                                      super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                      .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x14
                               ),i_00,(optional<unsigned_int>)0x0);
      replace_read(this,(Reg *)((long)_Var2.
                                      super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                      .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18
                               ),i_00,(optional<unsigned_int>)0x0);
      replace_read(this,(Reg *)((long)_Var2.
                                      super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                      .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x1c
                               ),i_00,(optional<unsigned_int>)0x0);
LAB_0015fcd0:
      invalidate_read(this,i_00);
      __v = (Reg *)((long)_Var2.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                          _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                          super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10);
      std::__detail::
      _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)local_190,__v);
      pre_alloc_transient._M_payload = (_Storage<unsigned_int,_true>)0x0;
      pre_alloc_transient._M_engaged = false;
      pre_alloc_transient._5_3_ = 0;
LAB_0015fcf7:
      RVar19 = pre_replace_write(this,__v,i_00,(optional<unsigned_int>)pre_alloc_transient);
      in_RSI = RVar19._0_8_;
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                (local_198,
                 (this->f->inst).
                 super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar16);
      replace_write(this,RVar19,i_00);
    }
    else {
      if (pp_Var3 == local_128) {
        iVar8 = *(int *)((long)_Var2.
                               super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8);
        if (iVar8 == 8) {
LAB_0015fc8c:
          replace_read(this,(Operand2 *)
                            ((long)_Var2.
                                   super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                   .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18),
                       i_00);
          goto LAB_0015fcd0;
        }
        if (iVar8 != 7) {
          if (iVar8 != 6) {
            replace_read(this,(Reg *)((long)_Var2.
                                            super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                            .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl
                                     + 0x10),i_00,(optional<unsigned_int>)0x0);
            replace_read(this,(Operand2 *)
                              ((long)_Var2.
                                     super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                     .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18)
                         ,i_00);
            goto LAB_0015fda8;
          }
          goto LAB_0015fc8c;
        }
        r = *(Reg *)((long)_Var2.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                           _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                           .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10);
        replace_read(this,(Reg *)((long)_Var2.
                                        super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                        .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl +
                                 0x10),i_00,(optional<unsigned_int>)0x0);
        invalidate_read(this,i_00);
        std::__detail::
        _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)local_190,
                 (Reg *)((long)_Var2.
                               super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10));
        pre_alloc_transient =
             (_Optional_payload_base<unsigned_int>)
             ((ulong)*(uint *)((long)_Var2.
                                     super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                     .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10)
             | 0x100000000);
        __v = &r;
        goto LAB_0015fcf7;
      }
      if (pp_Var3 == local_170) {
        if (*(char *)((long)_Var2.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x48) == '\x01'
           ) {
          replace_read(this,(MemoryOperand *)
                            ((long)_Var2.
                                   super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                   .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18),
                       i_00);
        }
        if (*(int *)((long)_Var2.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                           _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                           .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) == 0x1a)
        goto LAB_0015fcd0;
        replace_read(this,(Reg *)((long)_Var2.
                                        super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                        .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl +
                                 0x10),i_00,(optional<unsigned_int>)0x0);
LAB_0015fda8:
        invalidate_read(this,i_00);
LAB_0015fdb3:
        in_RSI = (Tag *)((this->f->inst).
                         super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar16);
        std::
        vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
        ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                  (local_198,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_RSI);
      }
      else {
        if (pp_Var3 == local_130) {
          puVar13 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar13 = &PTR__exception_001da1d8;
          __cxa_throw(puVar13,&prelude::NotImplementedException::typeinfo,std::exception::~exception
                     );
        }
        if (pp_Var3 == local_138) goto LAB_0015fda8;
        if (pp_Var3 != local_150) {
          if (pp_Var3 != local_158) {
            if (pp_Var3 == local_160) {
              bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)_Var2.
                                                super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                                .super__Head_base<0UL,_arm::Inst_*,_false>.
                                                _M_head_impl + 0x10),"offset_stack");
              if (bVar7) {
                iVar8 = std::any_cast<int>((any *)((long)_Var2.
                                                  super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                                  .super__Head_base<0UL,_arm::Inst_*,_false>.
                                                  _M_head_impl + 0x30));
                this->stack_offset = this->stack_offset + iVar8;
              }
            }
            goto LAB_0015fda8;
          }
          if ((this->delayed_store).
              super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
              super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_engaged !=
              false) {
            ppVar10 = std::optional<std::pair<unsigned_int,_unsigned_int>_>::value
                                ((optional<std::pair<unsigned_int,_unsigned_int>_> *)local_168);
            RVar19.kind = Spill;
            RVar19.from = ppVar10->first;
            RVar19.replace_with = ppVar10->second;
            replace_write(this,RVar19,i_00);
            local_108 = false;
            std::_Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>::_M_move_assign
                      (p_Var6,(_Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_> *)&r);
          }
          invalidate_read(this,i_00);
          if (*(int *)((long)_Var2.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                             super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) == 1) {
            if (this->bb_reset == true) {
              __position._M_node =
                   (((_List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                      *)&local_180->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
              p_Var15 = local_180;
              while (__position._M_node != p_Var15) {
                iVar12 = std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find(local_140,(key_type_conflict *)(__position._M_node + 1));
                if (iVar12.super__Node_iterator_base<unsigned_int,_false>._M_cur ==
                    (__node_type *)0x0) {
                  __position._M_node = (__position._M_node)->_M_next;
                  p_Var15 = local_180;
                }
                else {
                  local_148 = (undefined1 *)((long)&__position._M_node[1]._M_next + 4);
                  RVar17 = *(Reg *)((long)&__position._M_node[1]._M_next + 4);
                  iVar12 = std::
                           _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           ::find(local_190,(key_type_conflict *)(__position._M_node + 1));
                  force_free(this,RVar17,false,
                             iVar12.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                             (__node_type *)0x0);
                  std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::_M_erase(local_178,local_148);
                  p_Var15 = local_180;
                  __position = std::__cxx11::
                               list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                               ::erase(local_180,__position._M_node);
                }
              }
              std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::clear(local_190);
              this->bb_reset = false;
            }
          }
          else if (*(int *)((long)_Var2.
                                  super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                  .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) == 2)
          {
            this->is_leaf_func = false;
            RVar17 = *(Reg *)((long)_Var2.
                                    super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                    .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30);
            if (3 < (int)RVar17) {
              RVar17 = 4;
            }
            RVar14 = 0;
            RVar18 = 0;
            if (0 < (int)RVar17) {
              RVar14 = 0;
              RVar18 = RVar17;
            }
            for (; RVar18 != RVar14; RVar14 = RVar14 + 1) {
              r = RVar14;
              std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::_M_erase(local_178,&r);
            }
            for (; RVar17 != 4; RVar17 = RVar17 + 1) {
              force_free(this,RVar17,true,true);
            }
            force_free(this,0xc,true,true);
            force_free(this,0xe,true,true);
            std::
            vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
            ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                      (local_198,
                       (this->f->inst).
                       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar16);
            p_Var5 = local_178;
            r = 0;
            in_RSI = (Tag *)&r;
            std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_erase(local_178,in_RSI);
            r = 1;
            std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_erase(p_Var5,in_RSI);
            r = 2;
            std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_erase(p_Var5,in_RSI);
            r = 3;
            std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_erase(p_Var5,in_RSI);
            r = 0xc;
            std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_erase(p_Var5,in_RSI);
            r = 0xe;
            std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_erase(p_Var5);
            goto LAB_0015fdcc;
          }
          goto LAB_0015fdb3;
        }
        invalidate_read(this,i_00);
        std::
        vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
        ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                  (local_198,
                   (this->f->inst).
                   super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar16);
        lVar11 = std::__cxx11::string::find
                           ((char *)((long)_Var2.
                                           super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                           .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl +
                                    0x10),0x193ca5);
        if (((lVar11 == 0) &&
            (puVar1 = (this->inst_sink).
                      super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
            8 < (ulong)((long)puVar1 -
                       (long)(this->inst_sink).
                             super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start))) &&
           (pIVar4 = puVar1[-2]._M_t.
                     super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
                     super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl,
           (pIVar4->super_Displayable)._vptr_Displayable == local_170)) {
          puVar1[-2]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
          super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
          super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
               puVar1[-1]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
               _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
          puVar1[-1]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
          super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
          super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = pIVar4;
        }
        in_RSI = (Tag *)0x0;
        lVar11 = std::__cxx11::string::find
                           ((char)(long *)((long)_Var2.
                                                 super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                                 .super__Head_base<0UL,_arm::Inst_*,_false>.
                                                 _M_head_impl + 0x10),0);
        if (lVar11 != 0) {
          this->bb_reset = true;
        }
      }
    }
LAB_0015fdcc:
    p_Var6 = local_168;
    if ((this->delayed_store).
        super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
        super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_engaged == true) {
      ppVar10 = std::optional<std::pair<unsigned_int,_unsigned_int>_>::value
                          ((optional<std::pair<unsigned_int,_unsigned_int>_> *)local_168);
      r_00.kind = Spill;
      r_00.from = ppVar10->first;
      r_00.replace_with = ppVar10->second;
      replace_write(this,r_00,i_00);
      local_108 = false;
      in_RSI = (Tag *)&r;
      std::_Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>::_M_move_assign
                (p_Var6,(_Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_> *)in_RSI);
    }
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

void RegAllocator::perform_load_stores() {
  for (int i = 0; i < f.inst.size(); i++) {
    auto inst_ = &*f.inst[i];
    LOG(TRACE) << " " << std::endl << *inst_ << std::endl;
    cur_cond = inst_->cond;
    if (auto x = dynamic_cast<Arith3Inst *>(inst_)) {
      replace_read(x->r1, i);
      replace_read(x->r2, i);
      invalidate_read(i);
      wrote_to.insert(x->rd);
      auto prw = pre_replace_write(x->rd, i);
      inst_sink.push_back(std::move(f.inst[i]));
      replace_write(prw, i);
    } else if (auto x = dynamic_cast<Arith4Inst *>(inst_)) {
      replace_read(x->r1, i);
      replace_read(x->r2, i);
      replace_read(x->r3, i);
      invalidate_read(i);
      wrote_to.insert(x->rd);
      auto prw = pre_replace_write(x->rd, i);
      inst_sink.push_back(std::move(f.inst[i]));
      replace_write(prw, i);
    } else if (auto x = dynamic_cast<Arith2Inst *>(inst_)) {
      if (x->op == arm::OpCode::Mov || x->op == arm::OpCode::Mvn) {
        replace_read(x->r2, i);
        invalidate_read(i);
        wrote_to.insert(x->r1);
        auto prw = pre_replace_write(x->r1, i);
        inst_sink.push_back(std::move(f.inst[i]));
        replace_write(prw, i);
      } else if (x->op == arm::OpCode::MovT) {
        auto r = x->r1;
        replace_read(x->r1, i);
        invalidate_read(i);
        wrote_to.insert(x->r1);
        auto prw = pre_replace_write(r, i, x->r1);
        inst_sink.push_back(std::move(f.inst[i]));
        replace_write(prw, i);
      } else {
        replace_read(x->r1, i);
        replace_read(x->r2, i);
        invalidate_read(i);
        inst_sink.push_back(std::move(f.inst[i]));
      }
    } else if (auto x = dynamic_cast<LoadStoreInst *>(inst_)) {
      if (auto mem = std::get_if<MemoryOperand>(&x->mem)) {
        replace_read(*mem, i);
      }
      if (x->op == arm::OpCode::LdR) {
        invalidate_read(i);
        wrote_to.insert(x->rd);
        auto prw = pre_replace_write(x->rd, i);
        inst_sink.push_back(std::move(f.inst[i]));
        replace_write(prw, i);
      } else {
        // StR
        replace_read(x->rd, i);
        invalidate_read(i);
        inst_sink.push_back(std::move(f.inst[i]));
      }
    } else if (auto x = dynamic_cast<MultLoadStoreInst *>(inst_)) {
      throw prelude::NotImplementedException();
      if (x->op == arm::OpCode::LdM) {
        for (auto rd : x->rd) add_reg_write(rd, i);
      } else {
        // StM
        for (auto rd : x->rd) add_reg_read(rd, i);
      }
      invalidate_read(i);
      add_reg_read(x->rn, i);
    } else if (auto x = dynamic_cast<PushPopInst *>(inst_)) {
      // push pop only use gpr
      invalidate_read(i);
      inst_sink.push_back(std::move(f.inst[i]));
    } else if (auto x = dynamic_cast<LabelInst *>(inst_)) {
      invalidate_read(i);

      inst_sink.push_back(std::move(f.inst[i]));
      if (x->label.find(".ld_pc") == 0 && inst_sink.size() >= 2 &&
          dynamic_cast<LoadStoreInst *>(&**(inst_sink.end() - 2))) {
        // HACK: If it's load_pc label, delay store once more
        std::swap(*(inst_sink.end() - 2), *(inst_sink.end() - 1));
      }
      if (x->label.find(".bb" == 0)) {
        bb_reset = true;
      }
    } else if (auto x = dynamic_cast<BrInst *>(inst_)) {
      if (delayed_store) {
        // TODO: check if this is right
        auto [r, rd] = delayed_store.value();
        replace_write({r, rd, ReplaceWriteKind::Spill}, i);
        delayed_store = {};
      }
      invalidate_read(i);
      if (x->op == arm::OpCode::Bl) {
        is_leaf_func = false;
        auto &label = x->l;
        int param_cnt = x->param_cnt;
        int reg_cnt = std::min(param_cnt, 4);
        for (int i = 0; i < reg_cnt; i++) active.erase(Reg(i));
        for (int i = reg_cnt; i < 4; i++) force_free(Reg(i));
        // R12 should be freed whatever condition
        force_free(Reg(12));
        force_free(Reg(REG_LR));
        inst_sink.push_back(std::move(f.inst[i]));
        active.erase(Reg(0));
        active.erase(Reg(1));
        active.erase(Reg(2));
        active.erase(Reg(3));
        active.erase(Reg(12));
        active.erase(Reg(REG_LR));
      } else if (x->op == arm::OpCode::B) {
        if (bb_reset) {
          auto it = active_reg_map.begin();

          while (it != active_reg_map.end()) {
            if (spilled_cross_block_reg.find(it->first) !=
                spilled_cross_block_reg.end()) {
              force_free(it->second, false,
                         wrote_to.find(it->first) != wrote_to.end());
              active.erase(it->second);
              it = active_reg_map.erase(it);
            } else {
              it++;
            }
          }
          wrote_to.clear();
          bb_reset = false;
        }
        inst_sink.push_back(std::move(f.inst[i]));
      } else {
        inst_sink.push_back(std::move(f.inst[i]));
      }
    } else if (auto x = dynamic_cast<CtrlInst *>(inst_)) {
      if (x->key == "offset_stack") {
        int offset = std::any_cast<int>(x->val);
        stack_offset += offset;
      }
      invalidate_read(i);
      inst_sink.push_back(std::move(f.inst[i]));
    } else {
      invalidate_read(i);
      inst_sink.push_back(std::move(f.inst[i]));
    }
    if (delayed_store) {
      // TODO: check if this is right
      auto [r, rd] = delayed_store.value();
      replace_write({r, rd, ReplaceWriteKind::Spill}, i);
      delayed_store = {};
    }
  }
}